

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_26ba73::PulseCapture::open(PulseCapture *this,char *__file,int __oflag,...)

{
  PulseMainloop *this_00;
  pa_sample_spec *spec;
  ALCdevice *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  pa_sample_format_t pVar4;
  ALuint AVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int extraout_EAX;
  pa_context *ppVar9;
  pa_stream *ppVar10;
  pa_operation *op;
  backend_exception *pbVar11;
  ALCchar *pAVar12;
  char *pcVar13;
  long lVar14;
  undefined1 *__src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *local_d0;
  unique_lock<std::mutex> plock;
  pa_channel_map chanmap;
  
  if (__file == (char *)0x0) {
    local_d0 = (char *)0x0;
  }
  else {
    if ((anonymous_namespace)::CaptureDevices == DAT_0022a7e0) {
      PulseMainloop::probeCaptureDevices(&this->mMainloop);
    }
    pbVar2 = DAT_0022a7e0;
    lVar16 = (long)DAT_0022a7e0 - (long)(anonymous_namespace)::CaptureDevices;
    __lhs = (anonymous_namespace)::CaptureDevices;
    for (lVar14 = lVar16 >> 8; pbVar15 = __lhs, 0 < lVar14; lVar14 = lVar14 + -1) {
      bVar3 = std::operator==(__lhs,__file);
      if (bVar3) goto LAB_0016290d;
      bVar3 = std::operator==(__lhs + 2,__file);
      pbVar15 = __lhs + 2;
      if (bVar3) goto LAB_0016290d;
      bVar3 = std::operator==(__lhs + 4,__file);
      pbVar15 = __lhs + 4;
      if (bVar3) goto LAB_0016290d;
      bVar3 = std::operator==(__lhs + 6,__file);
      pbVar15 = __lhs + 6;
      if (bVar3) goto LAB_0016290d;
      __lhs = __lhs + 8;
      lVar16 = lVar16 + -0x100;
    }
    lVar16 = lVar16 >> 6;
    if (lVar16 == 1) {
LAB_001628fc:
      bVar3 = std::operator==(__lhs,__file);
      pbVar15 = pbVar2;
      if (bVar3) {
        pbVar15 = __lhs;
      }
    }
    else if (lVar16 == 2) {
LAB_001628d6:
      bVar3 = std::operator==(pbVar15,__file);
      if (!bVar3) {
        __lhs = pbVar15 + 2;
        goto LAB_001628fc;
      }
    }
    else {
      pbVar15 = pbVar2;
      if ((lVar16 == 3) && (bVar3 = std::operator==(__lhs,__file), pbVar15 = __lhs, !bVar3)) {
        pbVar15 = __lhs + 2;
        goto LAB_001628d6;
      }
    }
LAB_0016290d:
    if (pbVar15 == DAT_0022a7e0) {
      pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar11,0xa004,"Device name \"%s\" not found",__file)
      ;
      __cxa_throw(pbVar11,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    local_d0 = pbVar15[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_assign((string *)&((this->super_BackendBase).mDevice)->DeviceName);
  }
  this_00 = &this->mMainloop;
  std::unique_lock<std::mutex>::unique_lock(&plock,&(this->mMainloop).mMutex);
  ppVar9 = PulseMainloop::connectContext(this_00,&plock);
  this->mContext = ppVar9;
  memset(&chanmap,0,0x84);
  pAVar1 = (this->super_BackendBase).mDevice;
  switch(pAVar1->FmtChans) {
  case DevFmtMono:
    __src = (anonymous_namespace)::MonoChanMap;
    break;
  case DevFmtChannelsDefault:
    __src = (anonymous_namespace)::StereoChanMap;
    break;
  case DevFmtQuad:
    __src = (anonymous_namespace)::QuadChanMap;
    break;
  case DevFmtX51:
    __src = (anonymous_namespace)::X51ChanMap;
    break;
  case DevFmtX61:
    __src = (anonymous_namespace)::X61ChanMap;
    break;
  case DevFmtX71:
    __src = (anonymous_namespace)::X71ChanMap;
    break;
  case DevFmtAmbi3D:
    pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar12 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
    al::backend_exception::backend_exception(pbVar11,0xa004,"%s capture not supported",pAVar12);
    goto LAB_00162c75;
  case DevFmtX51Rear:
    __src = (anonymous_namespace)::X51RearChanMap;
    break;
  default:
    goto switchD_00162989_default;
  }
  memcpy(&chanmap,__src,0x84);
switchD_00162989_default:
  SetChannelOrderFromMap(pAVar1,&chanmap);
  pAVar1 = (this->super_BackendBase).mDevice;
  switch(pAVar1->FmtType) {
  case DevFmtByte:
  case DevFmtUShort:
  case DevFmtUInt:
    pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar12 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar11,0xa004,"%s capture samples not supported",pAVar12);
    goto LAB_00162c75;
  case DevFmtUByte:
    this->mSilentVal = 0x80;
    pVar4 = PA_SAMPLE_U8;
    break;
  case DevFmtShort:
    pVar4 = PA_SAMPLE_S16LE;
    break;
  case DevFmtInt:
    pVar4 = PA_SAMPLE_S32LE;
    break;
  case DevFmtFloat:
    pVar4 = PA_SAMPLE_FLOAT32LE;
    break;
  default:
    goto switchD_00162a03_default;
  }
  (this->mSpec).format = pVar4;
switchD_00162a03_default:
  spec = &this->mSpec;
  (this->mSpec).rate = pAVar1->Frequency;
  AVar5 = ALCdevice::channelsFromFmt(pAVar1);
  (this->mSpec).channels = (uint8_t)AVar5;
  iVar6 = (*(anonymous_namespace)::ppa_sample_spec_valid)(spec);
  if (iVar6 != 0) {
    iVar6 = (*(anonymous_namespace)::ppa_frame_size)(spec);
    pAVar1 = (this->super_BackendBase).mDevice;
    AVar5 = pAVar1->Frequency;
    uVar8 = pAVar1->BufferSize;
    uVar7 = (AVar5 * 100) / 1000;
    if (uVar7 < uVar8) {
      uVar7 = uVar8;
    }
    (this->mAttr).minreq = 0xffffffff;
    (this->mAttr).maxlength = uVar7 * iVar6;
    (this->mAttr).tlength = 0xffffffff;
    (this->mAttr).prebuf = 0xffffffff;
    uVar8 = (AVar5 * 0x32) / 1000;
    if (uVar8 <= uVar7) {
      uVar7 = uVar8;
    }
    (this->mAttr).fragsize = uVar7 * iVar6;
    iVar6 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
    if (2 < (int)gLogLevel) {
      pcVar13 = "(default)";
      if (local_d0 != (char *)0x0) {
        pcVar13 = local_d0;
      }
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Connecting to \"%s\"\n",pcVar13);
    }
    ppVar10 = PulseMainloop::connectStream
                        (this_00,local_d0,&plock,this->mContext,
                         (uint)(iVar6 == 0) << 9 | (PA_STREAM_ADJUST_LATENCY|PA_STREAM_START_CORKED)
                         ,&this->mAttr,spec,&chanmap,Capture);
    this->mStream = ppVar10;
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)(ppVar10,streamMovedCallbackC,this);
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(this->mStream,streamStateCallbackC,this)
    ;
    (*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
    std::__cxx11::string::assign((char *)&this->mDeviceName);
    if ((((this->super_BackendBase).mDevice)->DeviceName)._M_string_length == 0) {
      op = (pa_operation *)
           (*(anonymous_namespace)::ppa_context_get_source_info_by_name)
                     (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sourceNameCallbackC,this);
      PulseMainloop::waitForOperation(this_00,op,&plock);
    }
    std::unique_lock<std::mutex>::~unique_lock(&plock);
    return extraout_EAX;
  }
  pbVar11 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(pbVar11,0xa004,"Invalid sample format");
LAB_00162c75:
  __cxa_throw(pbVar11,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void PulseCapture::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    if(name)
    {
        if(CaptureDevices.empty())
            mMainloop.probeCaptureDevices();

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        mDevice->DeviceName = iter->name;
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_channel_map chanmap{};
    switch(mDevice->FmtChans)
    {
    case DevFmtMono:
        chanmap = MonoChanMap;
        break;
    case DevFmtStereo:
        chanmap = StereoChanMap;
        break;
    case DevFmtQuad:
        chanmap = QuadChanMap;
        break;
    case DevFmtX51:
        chanmap = X51ChanMap;
        break;
    case DevFmtX51Rear:
        chanmap = X51RearChanMap;
        break;
    case DevFmtX61:
        chanmap = X61ChanMap;
        break;
    case DevFmtX71:
        chanmap = X71ChanMap;
        break;
    case DevFmtAmbi3D:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture not supported",
            DevFmtChannelsString(mDevice->FmtChans)};
    }
    SetChannelOrderFromMap(mDevice, chanmap);

    switch(mDevice->FmtType)
    {
    case DevFmtUByte:
        mSilentVal = al::byte(0x80);
        mSpec.format = PA_SAMPLE_U8;
        break;
    case DevFmtShort:
        mSpec.format = PA_SAMPLE_S16NE;
        break;
    case DevFmtInt:
        mSpec.format = PA_SAMPLE_S32NE;
        break;
    case DevFmtFloat:
        mSpec.format = PA_SAMPLE_FLOAT32NE;
        break;
    case DevFmtByte:
    case DevFmtUShort:
    case DevFmtUInt:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    mSpec.rate = mDevice->Frequency;
    mSpec.channels = static_cast<uint8_t>(mDevice->channelsFromFmt());
    if(pa_sample_spec_valid(&mSpec) == 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Invalid sample format"};

    const ALuint frame_size{static_cast<ALuint>(pa_frame_size(&mSpec))};
    const ALuint samples{maxu(mDevice->BufferSize, 100 * mDevice->Frequency / 1000)};
    mAttr.minreq = ~0u;
    mAttr.prebuf = ~0u;
    mAttr.maxlength = samples * frame_size;
    mAttr.tlength = ~0u;
    mAttr.fragsize = minu(samples, 50*mDevice->Frequency/1000) * frame_size;

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, &mAttr, &mSpec, &chanmap,
        BackendType::Capture);

    pa_stream_set_moved_callback(mStream, &PulseCapture::streamMovedCallbackC, this);
    pa_stream_set_state_callback(mStream, &PulseCapture::streamStateCallbackC, this);

    mDeviceName = pa_stream_get_device_name(mStream);
    if(mDevice->DeviceName.empty())
    {
        pa_operation *op{pa_context_get_source_info_by_name(mContext, mDeviceName.c_str(),
            &PulseCapture::sourceNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
}